

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O0

void __thiscall
boost::unordered::detail::foa::
table_core<boost::unordered::detail::foa::flat_set_types<std::pair<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::pair<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_void>,_std::equal_to<std::pair<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::pair<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
::nosize_transfer_element
          (void *param_1,arrays_type *param_2,undefined8 param_3,undefined8 param_4,
          table_core<boost::unordered::detail::foa::flat_set_types<std::pair<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::pair<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_void>,_std::equal_to<std::pair<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::pair<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
          *param_5)

{
  destroy_element_on_exit d;
  arrays_type *in_stack_ffffffffffffff68;
  pair<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  *in_stack_ffffffffffffffb0;
  size_t in_stack_ffffffffffffffb8;
  arrays_type *arrays_;
  
  (param_5->arrays).groups_size_index = (param_5->arrays).groups_size_index + 1;
  arrays_ = param_2;
  position_for((size_t)param_1,in_stack_ffffffffffffff68);
  flat_set_types<std::pair<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::move((element_type *)param_2);
  table_core<boost::unordered::detail::foa::flat_set_types<std::pair<unsigned_int,std::vector<unsigned_int,std::allocator<unsigned_int>>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::pair<unsigned_int,std::vector<unsigned_int,std::allocator<unsigned_int>>>,void>,std::equal_to<std::pair<unsigned_int,std::vector<unsigned_int,std::allocator<unsigned_int>>>>,std::allocator<std::pair<unsigned_int,std::vector<unsigned_int,std::allocator<unsigned_int>>>>>
  ::
  nosize_unchecked_emplace_at<std::pair<unsigned_int,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
            (param_5,arrays_,(size_t)param_1,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  destroy_element_on_exit::~destroy_element_on_exit((destroy_element_on_exit *)0xa5c6a9);
  return;
}

Assistant:

void nosize_transfer_element(element_type* p, std::size_t hash, const arrays_type& arrays_,
                                 std::size_t& num_destroyed, std::true_type /* ->move */) {
        /* Destroy p even if an an exception is thrown in the middle of move
         * construction, which could leave the source half-moved.
         */
        ++num_destroyed;
        destroy_element_on_exit d{this, p};
        (void)d;
        nosize_unchecked_emplace_at(arrays_, position_for(hash, arrays_), hash,
                                    type_policy::move(*p));
    }